

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O3

SQInteger math_max(HSQUIRRELVM v)

{
  HSQOBJECT obj;
  bool bVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  long idx;
  SQInteger cres;
  SQObject objRes;
  SQObject cur;
  SQInteger local_60;
  HSQOBJECT local_58;
  HSQOBJECT local_40;
  
  SVar2 = sq_gettop(v);
  sq_getstackobj(v,2,&local_58);
  if (2 < SVar2) {
    idx = 3;
    do {
      sq_getstackobj(v,idx,&local_40);
      if ((local_40._type >> 0x1a & 1) == 0) {
        sq_throwparamtypeerror(v,idx,6,(ulong)local_40._type);
        return -1;
      }
      local_60 = 0;
      bVar1 = sq_cmpraw(v,&local_40,&local_58,&local_60);
      if (!bVar1) {
        SVar3 = sq_throwerror(v,"Internal error, comparison failed");
        return SVar3;
      }
      if (local_60 == 1) {
        local_58._flags = local_40._flags;
        local_58._5_3_ = local_40._5_3_;
        local_58._type = local_40._type;
        local_58._unVal = local_40._unVal;
      }
      bVar1 = idx != SVar2;
      idx = idx + 1;
    } while (bVar1);
  }
  obj._unVal.pTable = local_58._unVal.pTable;
  obj._type = local_58._type;
  obj._flags = local_58._flags;
  obj._5_3_ = local_58._5_3_;
  sq_pushobject(v,obj);
  return 1;
}

Assistant:

static SQInteger math_max(HSQUIRRELVM v)
{
  return math_min_max<+1>(v);
}